

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O0

void WriteAperiodicity(char *filename,int fs,int f0_length,double frame_period,int fft_size,
                      int number_of_dimensions,double **aperiodicity)

{
  FILE *__s;
  int local_40;
  int local_3c;
  int i;
  FILE *fp;
  double **aperiodicity_local;
  int number_of_dimensions_local;
  int fft_size_local;
  double frame_period_local;
  int f0_length_local;
  int fs_local;
  char *filename_local;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    printf("File cannot be opened.\n");
  }
  else {
    fwrite("AP  ",1,4,__s);
    anon_unknown.dwarf_b4bf::WriteOneParameter((FILE *)__s,"NOF ",(double)f0_length,4);
    anon_unknown.dwarf_b4bf::WriteOneParameter((FILE *)__s,"FP  ",frame_period,8);
    anon_unknown.dwarf_b4bf::WriteOneParameter((FILE *)__s,"FFT ",(double)fft_size,4);
    anon_unknown.dwarf_b4bf::WriteOneParameter((FILE *)__s,"NOD ",(double)number_of_dimensions,4);
    anon_unknown.dwarf_b4bf::WriteOneParameter((FILE *)__s,"FS  ",(double)fs,4);
    local_40 = number_of_dimensions;
    if (number_of_dimensions == 0) {
      local_40 = fft_size / 2 + 1;
    }
    for (local_3c = 0; local_3c < f0_length; local_3c = local_3c + 1) {
      fwrite(aperiodicity[local_3c],8,(long)local_40,__s);
    }
    fclose(__s);
  }
  return;
}

Assistant:

void WriteAperiodicity(const char *filename, int fs, int f0_length,
    double frame_period, int fft_size, int number_of_dimensions,
    const double * const *aperiodicity) {
  FILE *fp = fopen(filename, "wb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return;
  }

  // Header
  fwrite("AP  ", 1, 4, fp);

  // Parameters
  WriteOneParameter(fp, "NOF ", f0_length, 4);
  WriteOneParameter(fp, "FP  ", frame_period, 8);
  WriteOneParameter(fp, "FFT ", fft_size, 4);
  WriteOneParameter(fp, "NOD ", number_of_dimensions, 4);
  WriteOneParameter(fp, "FS  ", fs, 4);
  number_of_dimensions =
    number_of_dimensions == 0 ? fft_size / 2 + 1 : number_of_dimensions;

  // Data
  for (int i = 0; i < f0_length; ++i)
    fwrite(aperiodicity[i], 8, number_of_dimensions, fp);
  fclose(fp);
}